

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flatfile_tests.cpp
# Opt level: O1

void __thiscall flatfile_tests::flatfile_open::test_method(flatfile_open *this)

{
  long lVar1;
  size_type sVar2;
  int iVar3;
  iterator in_R8;
  iterator pvVar4;
  iterator in_R9;
  iterator pvVar5;
  uint uVar6;
  long in_FS_OFFSET;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string file_04;
  const_string file_05;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  check_type cVar7;
  path in_stack_fffffffffffffcc8;
  char *local_308;
  char *local_300;
  undefined1 *local_2f8;
  undefined1 *local_2f0;
  char *local_2e8;
  char *local_2e0;
  undefined1 *local_2d8;
  undefined1 *local_2d0;
  char *local_2c8;
  char *local_2c0;
  undefined1 *local_2b8;
  undefined1 *local_2b0;
  char *local_2a8;
  char *local_2a0;
  undefined1 *local_298;
  undefined1 *local_290;
  char *local_288;
  char *local_280;
  lazy_ostream local_278;
  undefined1 *local_268;
  char *local_260;
  undefined1 *local_258;
  undefined1 *local_250;
  char *local_248;
  char *local_240;
  AutoFile local_238 [2];
  char *local_1e8;
  char *local_1e0;
  undefined1 *local_1d8;
  undefined1 *local_1d0;
  char *local_1c8;
  char *local_1c0;
  undefined1 *local_1b8;
  undefined1 *local_1b0;
  char *local_1a8;
  char *local_1a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_198;
  AutoFile local_190;
  string *local_170;
  char *local_168;
  char *local_160;
  assertion_result local_158;
  string text;
  string line2;
  string line1;
  path local_e0;
  FlatFileSeq seq;
  path data_dir;
  string text_2;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  ArgsManager::GetDataDir
            ((path *)&data_dir.super_path,&(this->super_BOOST_AUTO_TEST_CASE_FIXTURE).m_args,false);
  std::filesystem::__cxx11::path::path(&local_e0,&data_dir.super_path);
  FlatFileSeq::FlatFileSeq(&seq,(path)in_stack_fffffffffffffcc8,(char *)&local_e0,0xec3ed7);
  std::filesystem::__cxx11::path::~path(&local_e0);
  line1._M_dataplus._M_p = (pointer)&line1.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&line1,
             "A purely peer-to-peer version of electronic cash would allow online payments to be sent directly from one party to another without going through a financial institution."
             ,"");
  line2._M_dataplus._M_p = (pointer)&line2.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&line2,
             "Digital signatures provide part of the solution, but the main benefits are lost if a trusted third party is still required to prevent double-spending."
             ,"");
  sVar2 = line1._M_string_length;
  iVar3 = 1;
  if ((0xfc < line1._M_string_length) && (iVar3 = 3, 0xffff < line1._M_string_length)) {
    iVar3 = (uint)(line1._M_string_length >> 0x20 != 0) * 4 + 5;
  }
  local_190.m_file = (FILE *)0x0;
  text_2._M_dataplus._M_p = (pointer)FlatFileSeq::Open(&seq,(FlatFilePos *)&local_190,false);
  text_2._M_string_length = 0;
  text_2.field_2._M_allocated_capacity = 0;
  text_2.field_2._8_8_ = 0;
  Serialize<AutoFile,char>((AutoFile *)&text_2,&line1);
  uVar6 = iVar3 + (int)sVar2;
  AutoFile::~AutoFile((AutoFile *)&text_2);
  local_190.m_file = (FILE *)((ulong)uVar6 << 0x20);
  text_2._M_dataplus._M_p = (pointer)FlatFileSeq::Open(&seq,(FlatFilePos *)&local_190,true);
  text_2._M_string_length = 0;
  text_2.field_2._M_allocated_capacity = 0;
  text_2.field_2._8_8_ = 0;
  local_1a8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/flatfile_tests.cpp"
  ;
  local_1a0 = "";
  local_1b8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1b0 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x36;
  file.m_begin = (iterator)&local_1a8;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_1b8,msg);
  Serialize<AutoFile,char>((AutoFile *)&text_2,&line2);
  local_1c8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/flatfile_tests.cpp"
  ;
  local_1c0 = "";
  local_1d8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1d0 = &boost::unit_test::basic_cstring<char_const>::null;
  _cVar7 = 0x3c908f;
  file_00.m_end = (iterator)0x36;
  file_00.m_begin = (iterator)&local_1c8;
  msg_00.m_end = in_R9;
  msg_00.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_1d8,
             msg_00);
  text._M_dataplus._M_p = text._M_dataplus._M_p & 0xffffffffffffff00;
  text._M_string_length = 0;
  text.field_2._M_allocated_capacity = 0;
  local_190.m_xor.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)((ulong)local_190.m_xor.super__Vector_base<std::byte,_std::allocator<std::byte>_>.
                        _M_impl.super__Vector_impl_data._M_start & 0xffffffffffffff00);
  local_190.m_file = (FILE *)&PTR__lazy_ostream_013d3ef0;
  local_190.m_xor.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_finish = boost::unit_test::lazy_ostream::inst;
  local_190.m_xor.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0xe80289;
  local_1e8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/flatfile_tests.cpp"
  ;
  local_1e0 = "";
  pvVar4 = (iterator)0x1;
  pvVar5 = (iterator)0x1;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&text,(lazy_ostream *)&local_190,1,1,WARN,_cVar7,(size_t)&local_1e8
             ,0x36);
  boost::detail::shared_count::~shared_count((shared_count *)&text.field_2._M_allocated_capacity);
  AutoFile::~AutoFile((AutoFile *)&text_2);
  local_190.m_file = (FILE *)((ulong)uVar6 << 0x20);
  text_2._M_dataplus._M_p = (pointer)FlatFileSeq::Open(&seq,(FlatFilePos *)&local_190,false);
  text_2._M_string_length = 0;
  text_2.field_2._M_allocated_capacity = 0;
  text_2.field_2._8_8_ = 0;
  Serialize<AutoFile,char>((AutoFile *)&text_2,&line2);
  AutoFile::~AutoFile((AutoFile *)&text_2);
  text._M_dataplus._M_p = (pointer)&text.field_2;
  text._M_string_length = 0;
  text.field_2._M_allocated_capacity = text.field_2._M_allocated_capacity & 0xffffffffffffff00;
  text_2._M_dataplus._M_p = (pointer)0x0;
  local_238[0].m_file = FlatFileSeq::Open(&seq,(FlatFilePos *)&text_2,true);
  local_238[0].m_xor.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_238[0].m_xor.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_238[0].m_xor.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  LimitedStringFormatter<256UL>::Unser<AutoFile>
            ((LimitedStringFormatter<256UL> *)&text_2,local_238,&text);
  local_248 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/flatfile_tests.cpp"
  ;
  local_240 = "";
  local_258 = &boost::unit_test::basic_cstring<char_const>::null;
  local_250 = &boost::unit_test::basic_cstring<char_const>::null;
  file_01.m_end = (iterator)0x45;
  file_01.m_begin = (iterator)&local_248;
  msg_01.m_end = pvVar5;
  msg_01.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_258,
             msg_01);
  local_278.m_empty = false;
  local_278._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013d3cb0;
  local_268 = boost::unit_test::lazy_ostream::inst;
  local_260 = "";
  if (text._M_string_length == line1._M_string_length) {
    if (text._M_string_length == 0) {
      local_158.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
           (readonly_property<bool>)(class_property<bool>)0x1;
    }
    else {
      iVar3 = bcmp(text._M_dataplus._M_p,line1._M_dataplus._M_p,text._M_string_length);
      local_158.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
           (readonly_property<bool>)(iVar3 == 0);
    }
  }
  else {
    local_158.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)(class_property<bool>)0x0;
  }
  local_158.m_message.px = (element_type *)0x0;
  local_158.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_168 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/flatfile_tests.cpp"
  ;
  local_160 = "";
  text_2.field_2._8_8_ = &local_170;
  text_2._M_string_length = text_2._M_string_length & 0xffffffffffffff00;
  text_2._M_dataplus._M_p = (pointer)&PTR__lazy_ostream_013d3d70;
  text_2.field_2._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_190.m_xor.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)&local_198;
  local_190.m_xor.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)((ulong)local_190.m_xor.super__Vector_base<std::byte,_std::allocator<std::byte>_>.
                        _M_impl.super__Vector_impl_data._M_start & 0xffffffffffffff00);
  local_190.m_file = (FILE *)&PTR__lazy_ostream_013d3d70;
  local_190.m_xor.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_finish = boost::unit_test::lazy_ostream::inst;
  pvVar4 = (iterator)0x1;
  pvVar5 = (iterator)0x2;
  local_198 = &line1;
  local_170 = &text;
  boost::test_tools::tt_detail::report_assertion
            (&local_158,&local_278,1,2,REQUIRE,0xffac96,(size_t)&local_168,0x45,&text_2,"line1",
             &local_190);
  boost::detail::shared_count::~shared_count(&local_158.m_message.pn);
  LimitedStringFormatter<256UL>::Unser<AutoFile>
            ((LimitedStringFormatter<256UL> *)&text_2,local_238,&text);
  local_288 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/flatfile_tests.cpp"
  ;
  local_280 = "";
  local_298 = &boost::unit_test::basic_cstring<char_const>::null;
  local_290 = &boost::unit_test::basic_cstring<char_const>::null;
  file_02.m_end = (iterator)0x48;
  file_02.m_begin = (iterator)&local_288;
  msg_02.m_end = pvVar5;
  msg_02.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_298,
             msg_02);
  local_278.m_empty = false;
  local_278._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013d3cb0;
  local_268 = boost::unit_test::lazy_ostream::inst;
  local_260 = "";
  if (text._M_string_length == line2._M_string_length) {
    if (text._M_string_length == 0) {
      local_158.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
           (readonly_property<bool>)(class_property<bool>)0x1;
    }
    else {
      iVar3 = bcmp(text._M_dataplus._M_p,line2._M_dataplus._M_p,text._M_string_length);
      local_158.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
           (readonly_property<bool>)(iVar3 == 0);
    }
  }
  else {
    local_158.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)(class_property<bool>)0x0;
  }
  local_158.m_message.px = (element_type *)0x0;
  local_158.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_168 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/flatfile_tests.cpp"
  ;
  local_160 = "";
  text_2._M_string_length = text_2._M_string_length & 0xffffffffffffff00;
  text_2._M_dataplus._M_p = (pointer)&PTR__lazy_ostream_013d3d70;
  text_2.field_2._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  text_2.field_2._8_8_ = &local_170;
  local_198 = &line2;
  local_190.m_xor.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)((ulong)local_190.m_xor.super__Vector_base<std::byte,_std::allocator<std::byte>_>.
                        _M_impl.super__Vector_impl_data._M_start & 0xffffffffffffff00);
  local_190.m_file = (FILE *)&PTR__lazy_ostream_013d3d70;
  local_190.m_xor.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_finish = boost::unit_test::lazy_ostream::inst;
  local_190.m_xor.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)&local_198;
  pvVar4 = (iterator)0x1;
  pvVar5 = (iterator)0x2;
  local_170 = &text;
  boost::test_tools::tt_detail::report_assertion
            (&local_158,&local_278,1,2,REQUIRE,0xffac96,(size_t)&local_168,0x48,&text_2,"line2",
             &local_190);
  boost::detail::shared_count::~shared_count(&local_158.m_message.pn);
  AutoFile::~AutoFile(local_238);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)text._M_dataplus._M_p != &text.field_2) {
    operator_delete(text._M_dataplus._M_p,text.field_2._M_allocated_capacity + 1);
  }
  text._M_dataplus._M_p = (pointer)&text.field_2;
  text._M_string_length = 0;
  text.field_2._M_allocated_capacity = text.field_2._M_allocated_capacity & 0xffffffffffffff00;
  text_2._M_dataplus._M_p = (pointer)((ulong)uVar6 << 0x20);
  local_238[0].m_file = FlatFileSeq::Open(&seq,(FlatFilePos *)&text_2,false);
  local_238[0].m_xor.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_238[0].m_xor.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_238[0].m_xor.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  LimitedStringFormatter<256UL>::Unser<AutoFile>
            ((LimitedStringFormatter<256UL> *)&text_2,local_238,&text);
  local_2a8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/flatfile_tests.cpp"
  ;
  local_2a0 = "";
  local_2b8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2b0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_03.m_end = (iterator)0x51;
  file_03.m_begin = (iterator)&local_2a8;
  msg_03.m_end = pvVar5;
  msg_03.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_2b8,
             msg_03);
  local_278.m_empty = false;
  local_278._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013d3cb0;
  local_268 = boost::unit_test::lazy_ostream::inst;
  local_260 = "";
  if (text._M_string_length == line2._M_string_length) {
    if (text._M_string_length == 0) {
      local_158.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
           (readonly_property<bool>)(class_property<bool>)0x1;
    }
    else {
      iVar3 = bcmp(text._M_dataplus._M_p,line2._M_dataplus._M_p,text._M_string_length);
      local_158.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
           (readonly_property<bool>)(iVar3 == 0);
    }
  }
  else {
    local_158.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)(class_property<bool>)0x0;
  }
  local_158.m_message.px = (element_type *)0x0;
  local_158.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_168 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/flatfile_tests.cpp"
  ;
  local_160 = "";
  text_2._M_string_length = text_2._M_string_length & 0xffffffffffffff00;
  text_2._M_dataplus._M_p = (pointer)&PTR__lazy_ostream_013d3d70;
  text_2.field_2._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  text_2.field_2._8_8_ = &local_170;
  local_198 = &line2;
  local_190.m_xor.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)((ulong)local_190.m_xor.super__Vector_base<std::byte,_std::allocator<std::byte>_>.
                        _M_impl.super__Vector_impl_data._M_start & 0xffffffffffffff00);
  local_190.m_file = (FILE *)&PTR__lazy_ostream_013d3d70;
  local_190.m_xor.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_finish = boost::unit_test::lazy_ostream::inst;
  local_190.m_xor.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)&local_198;
  pvVar4 = (iterator)0x1;
  pvVar5 = (iterator)0x2;
  local_170 = &text;
  boost::test_tools::tt_detail::report_assertion
            (&local_158,&local_278,1,2,REQUIRE,0xffac96,(size_t)&local_168,0x51,&text_2,"line2",
             &local_190);
  boost::detail::shared_count::~shared_count(&local_158.m_message.pn);
  AutoFile::~AutoFile(local_238);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)text._M_dataplus._M_p != &text.field_2) {
    operator_delete(text._M_dataplus._M_p,text.field_2._M_allocated_capacity + 1);
  }
  text_2._M_string_length = 0;
  text_2.field_2._M_allocated_capacity = text_2.field_2._M_allocated_capacity & 0xffffffffffffff00;
  text._M_dataplus._M_p._4_4_ = uVar6;
  text._M_dataplus._M_p._0_4_ = 1;
  text_2._M_dataplus._M_p = (pointer)&text_2.field_2;
  local_190.m_file = FlatFileSeq::Open(&seq,(FlatFilePos *)&text,false);
  local_190.m_xor.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_190.m_xor.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_190.m_xor.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_2c8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/flatfile_tests.cpp"
  ;
  local_2c0 = "";
  local_2d8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2d0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_04.m_end = &DAT_00000058;
  file_04.m_begin = (iterator)&local_2c8;
  msg_04.m_end = pvVar5;
  msg_04.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_2d8,
             msg_04);
  LimitedStringFormatter<256UL>::Unser<AutoFile>
            ((LimitedStringFormatter<256UL> *)&local_278,&local_190,&text_2);
  local_2e8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/flatfile_tests.cpp"
  ;
  local_2e0 = "";
  local_2f8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2f0 = &boost::unit_test::basic_cstring<char_const>::null;
  _cVar7 = 0x3c985c;
  file_05.m_end = &DAT_00000058;
  file_05.m_begin = (iterator)&local_2e8;
  msg_05.m_end = pvVar5;
  msg_05.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,(size_t)&local_2f8,
             msg_05);
  local_238[0].m_file = (FILE *)((ulong)local_238[0].m_file & 0xffffffffffffff00);
  local_238[0].m_xor.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_238[0].m_xor.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  text._M_string_length = text._M_string_length & 0xffffffffffffff00;
  text._M_dataplus._M_p = (pointer)&PTR__lazy_ostream_013d3ef0;
  text.field_2._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  text.field_2._8_8_ = anon_var_dwarf_1a1a49;
  local_308 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/flatfile_tests.cpp"
  ;
  local_300 = "";
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_238,(lazy_ostream *)&text,1,1,WARN,_cVar7,(size_t)&local_308,
             0x58);
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             &local_238[0].m_xor.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
              super__Vector_impl_data._M_finish);
  AutoFile::~AutoFile(&local_190);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)text_2._M_dataplus._M_p != &text_2.field_2) {
    operator_delete(text_2._M_dataplus._M_p,text_2.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)line2._M_dataplus._M_p != &line2.field_2) {
    operator_delete(line2._M_dataplus._M_p,line2.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)line1._M_dataplus._M_p != &line1.field_2) {
    operator_delete(line1._M_dataplus._M_p,line1.field_2._M_allocated_capacity + 1);
  }
  std::filesystem::__cxx11::path::~path((path *)&seq);
  std::filesystem::__cxx11::path::~path(&data_dir.super_path);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(flatfile_open)
{
    const auto data_dir = m_args.GetDataDirBase();
    FlatFileSeq seq(data_dir, "a", 16 * 1024);

    std::string line1("A purely peer-to-peer version of electronic cash would allow online "
                      "payments to be sent directly from one party to another without going "
                      "through a financial institution.");
    std::string line2("Digital signatures provide part of the solution, but the main benefits are "
                      "lost if a trusted third party is still required to prevent double-spending.");

    size_t pos1 = 0;
    size_t pos2 = pos1 + GetSerializeSize(line1);

    // Write first line to file.
    {
        AutoFile file{seq.Open(FlatFilePos(0, pos1))};
        file << LIMITED_STRING(line1, 256);
    }

    // Attempt to append to file opened in read-only mode.
    {
        AutoFile file{seq.Open(FlatFilePos(0, pos2), true)};
        BOOST_CHECK_THROW(file << LIMITED_STRING(line2, 256), std::ios_base::failure);
    }

    // Append second line to file.
    {
        AutoFile file{seq.Open(FlatFilePos(0, pos2))};
        file << LIMITED_STRING(line2, 256);
    }

    // Read text from file in read-only mode.
    {
        std::string text;
        AutoFile file{seq.Open(FlatFilePos(0, pos1), true)};

        file >> LIMITED_STRING(text, 256);
        BOOST_CHECK_EQUAL(text, line1);

        file >> LIMITED_STRING(text, 256);
        BOOST_CHECK_EQUAL(text, line2);
    }

    // Read text from file with position offset.
    {
        std::string text;
        AutoFile file{seq.Open(FlatFilePos(0, pos2))};

        file >> LIMITED_STRING(text, 256);
        BOOST_CHECK_EQUAL(text, line2);
    }

    // Ensure another file in the sequence has no data.
    {
        std::string text;
        AutoFile file{seq.Open(FlatFilePos(1, pos2))};
        BOOST_CHECK_THROW(file >> LIMITED_STRING(text, 256), std::ios_base::failure);
    }
}